

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * GenerateSystem24Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  bool bVar1;
  int gap3_bytes;
  reference sector;
  BitBuffer *bitstream;
  int gap3;
  Sector *s;
  const_iterator __end1;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_b0;
  const_iterator __begin1;
  Track *__range1;
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = IsSystem24Track(track);
  if (!bVar1) {
    __assert_fail("IsSystem24Track(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x92,"TrackData GenerateSystem24Track(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)&__range1,_500K,MFM);
  __begin1._M_current = (Sector *)bitbuf.m_buffer._96_8_;
  local_b0._M_current = (Sector *)Track::begin((Track *)bitbuf.m_buffer._96_8_);
  s = (Sector *)Track::end(__begin1._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_b0,
                       (__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                        *)&s);
    if (!bVar1) break;
    sector = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator*(&local_b0);
    gap3_bytes = 0x29;
    if ((sector->header).sector < 6) {
      gap3_bytes = 0x34;
    }
    TrackBuilder::addSector((TrackBuilder *)&__range1,sector,gap3_bytes);
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&local_b0);
  }
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)&__range1);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateSystem24Track(const CylHead& cylhead, const Track& track)
{
    assert(IsSystem24Track(track));

    BitstreamTrackBuilder bitbuf(DataRate::_500K, Encoding::MFM);

    for (auto& s : track)
    {
        auto gap3{ (s.header.sector < 6) ? 52 : 41 };
        bitbuf.addSector(s, gap3);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}